

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

void __thiscall dg::llvmdg::legacy::Block::dumpEdges(Block *this,ostream *ostream)

{
  Function *this_00;
  bool bVar1;
  reference ppBVar2;
  ostream *poVar3;
  reference ppVar4;
  ostream *poVar5;
  int iVar6;
  ostream *in_RSI;
  _Self *__y;
  long in_RDI;
  pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*> join;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *__range2_3;
  pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*> fork;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *__range2_2;
  pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*> callee;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *__range2_1;
  Block *successor;
  iterator __end2;
  iterator __begin2;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *__range2;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *in_stack_fffffffffffffdb8;
  _Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *in_stack_fffffffffffffdc0;
  string local_1e8 [32];
  string local_1c8 [32];
  Function *local_1a8;
  Function *local_1a0;
  _Self local_198;
  _Self local_190;
  long local_188;
  string local_180 [32];
  string local_160 [32];
  Function *local_140;
  Function *local_138;
  _Self local_130;
  _Self local_128;
  long local_120;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [16];
  Block *in_stack_ffffffffffffff58;
  _Self local_88;
  _Self local_80;
  long local_78;
  string local_70 [32];
  string local_50 [32];
  Block *local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  ostream *local_10;
  
  local_18 = in_RDI + 0x50;
  local_10 = in_RSI;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::begin((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                *)in_stack_fffffffffffffdb8);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::end((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              *)in_stack_fffffffffffffdb8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppBVar2 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                        ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x217255);
    poVar3 = local_10;
    local_30 = *ppBVar2;
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar3 = std::operator<<(poVar3,local_50);
    poVar3 = std::operator<<(poVar3," -> ");
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar3 = std::operator<<(poVar3,local_70);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator++(in_stack_fffffffffffffdc0)
    ;
  }
  local_78 = in_RDI + 0x88;
  local_80._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
       ::begin(in_stack_fffffffffffffdb8);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
       ::end(in_stack_fffffffffffffdb8);
  while( true ) {
    bVar1 = std::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                          *)0x21736f);
    poVar3 = local_10;
    this_00 = ppVar4->second;
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar3 = std::operator<<(poVar3,local_b8);
    poVar3 = std::operator<<(poVar3," -> ");
    Function::entry(this_00);
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar3 = std::operator<<(poVar3,local_d8);
    iVar6 = 0x273063;
    std::operator<<(poVar3," [style=dashed, constraint=false]\n");
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_b8);
    poVar3 = local_10;
    Function::exit(this_00,iVar6);
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar3 = std::operator<<(poVar3,local_f8);
    poVar3 = std::operator<<(poVar3," -> ");
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar3 = std::operator<<(poVar3,local_118);
    std::operator<<(poVar3," [style=dashed, constraint=false]\n");
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_f8);
    std::
    _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                  *)in_stack_fffffffffffffdc0);
  }
  local_120 = in_RDI + 0xb8;
  local_128._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
       ::begin(in_stack_fffffffffffffdb8);
  local_130._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
       ::end(in_stack_fffffffffffffdb8);
  while( true ) {
    bVar1 = std::operator!=(&local_128,&local_130);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                          *)0x21753a);
    poVar3 = local_10;
    local_140 = ppVar4->first;
    local_138 = ppVar4->second;
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar3 = std::operator<<(poVar3,local_160);
    poVar3 = std::operator<<(poVar3," -> ");
    Function::entry(local_138);
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar3 = std::operator<<(poVar3,local_180);
    std::operator<<(poVar3," [style=dotted, constraint=false]\n");
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_160);
    std::
    _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                  *)in_stack_fffffffffffffdc0);
  }
  local_188 = in_RDI + 0xe8;
  local_190._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
       ::begin(in_stack_fffffffffffffdb8);
  local_198._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
       ::end(in_stack_fffffffffffffdb8);
  while( true ) {
    __y = &local_198;
    bVar1 = std::operator!=(&local_190,__y);
    iVar6 = (int)__y;
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                          *)0x217668);
    local_1a8 = ppVar4->first;
    local_1a0 = ppVar4->second;
    poVar3 = local_10;
    Function::exit(local_1a0,iVar6);
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar5 = std::operator<<(poVar3,local_1c8);
    poVar5 = std::operator<<(poVar5," -> ");
    dotName_abi_cxx11_(in_stack_ffffffffffffff58);
    poVar5 = std::operator<<(poVar5,local_1e8);
    std::operator<<(poVar5," [style=dotted, constraint=false]\n");
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_1c8);
    std::
    _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                  *)poVar3);
  }
  return;
}

Assistant:

void Block::dumpEdges(std::ostream &ostream) const {
    for (auto *successor : successors_) {
        ostream << this->dotName() << " -> " << successor->dotName() << "\n";
    }

    for (auto callee : callees_) {
        ostream << this->dotName() << " -> "
                << callee.second->entry()->dotName()
                << " [style=dashed, constraint=false]\n";
        ostream << callee.second->exit()->dotName() << " -> " << this->dotName()
                << " [style=dashed, constraint=false]\n";
    }

    for (auto fork : forks_) {
        ostream << this->dotName() << " -> " << fork.second->entry()->dotName()
                << " [style=dotted, constraint=false]\n";
    }

    for (auto join : joins_) {
        ostream << join.second->exit()->dotName() << " -> " << this->dotName()
                << " [style=dotted, constraint=false]\n";
    }
}